

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter.h
# Opt level: O0

bool winmd::reader::filter::match
               (string_view *type_namespace,string_view *type_name,string_view *match)

{
  string_view *psVar1;
  string_view *value;
  bool bVar2;
  size_type sVar3;
  size_type sVar4;
  const_reference pvVar5;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  string_view *local_28;
  string_view *match_local;
  string_view *type_name_local;
  string_view *type_namespace_local;
  
  local_28 = match;
  match_local = type_name;
  type_name_local = type_namespace;
  sVar3 = cppwinrt::std::basic_string_view<char,_std::char_traits<char>_>::size(match);
  sVar4 = cppwinrt::std::basic_string_view<char,_std::char_traits<char>_>::size(type_name_local);
  if (sVar4 < sVar3) {
    bVar2 = impl::starts_with(local_28,type_name_local);
    psVar1 = local_28;
    if (bVar2) {
      sVar3 = cppwinrt::std::basic_string_view<char,_std::char_traits<char>_>::size(type_name_local)
      ;
      pvVar5 = cppwinrt::std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                         (psVar1,sVar3);
      value = match_local;
      psVar1 = local_28;
      if (*pvVar5 == '.') {
        sVar3 = cppwinrt::std::basic_string_view<char,_std::char_traits<char>_>::size
                          (type_name_local);
        local_38 = cppwinrt::std::basic_string_view<char,_std::char_traits<char>_>::substr
                             (psVar1,sVar3 + 1,0xffffffffffffffff);
        type_namespace_local._7_1_ = impl::starts_with(value,&local_38);
      }
      else {
        type_namespace_local._7_1_ = false;
      }
    }
    else {
      type_namespace_local._7_1_ = false;
    }
  }
  else {
    type_namespace_local._7_1_ = impl::starts_with(type_name_local,local_28);
  }
  return type_namespace_local._7_1_;
}

Assistant:

static bool match(std::string_view const& type_namespace, std::string_view const& type_name, std::string_view const& match) noexcept
        {
            if (match.size() <= type_namespace.size())
            {
                return impl::starts_with(type_namespace, match);
            }

            if (!impl::starts_with(match, type_namespace))
            {
                return false;
            }

            if (match[type_namespace.size()] != '.')
            {
                return false;
            }

            return impl::starts_with(type_name, match.substr(type_namespace.size() + 1));
        }